

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue_write.cpp
# Opt level: O0

string * json_escape(string *inS)

{
  ulong uVar1;
  byte *pbVar2;
  ulong in_RSI;
  char *escStr;
  uint local_30;
  uchar ch;
  uint i;
  string *inS_local;
  string *outS;
  
  std::__cxx11::string::string((string *)inS);
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)inS);
  for (local_30 = 0; uVar1 = std::__cxx11::string::size(), local_30 < uVar1; local_30 = local_30 + 1
      ) {
    pbVar2 = (byte *)std::__cxx11::string::operator[](in_RSI);
    if (escapes[*pbVar2] == (char *)0x0) {
      std::__cxx11::string::operator+=((string *)inS,*pbVar2);
    }
    else {
      std::__cxx11::string::operator+=((string *)inS,escapes[*pbVar2]);
    }
  }
  return inS;
}

Assistant:

static std::string json_escape(const std::string& inS)
{
    std::string outS;
    outS.reserve(inS.size() * 2);

    for (unsigned int i = 0; i < inS.size(); i++) {
        unsigned char ch = inS[i];
        const char *escStr = escapes[ch];

        if (escStr)
            outS += escStr;
        else
            outS += ch;
    }

    return outS;
}